

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int push_additional_extensions(ptls_handshake_properties_t *properties,ptls_buffer_t *sendbuf)

{
  size_t sVar1;
  int iVar2;
  ptls_buffer_t *in_RSI;
  long in_RDI;
  size_t body_size;
  size_t body_start;
  size_t capacity;
  uint16_t _v;
  ptls_raw_extension_t *ext;
  int ret;
  size_t in_stack_ffffffffffffffa8;
  void *in_stack_ffffffffffffffb0;
  ptls_buffer_t *in_stack_ffffffffffffffb8;
  size_t sVar3;
  long local_30;
  short *local_20;
  
  if ((in_RDI != 0) && (*(long *)(in_RDI + 0x68) != 0)) {
    for (local_20 = *(short **)(in_RDI + 0x68); *local_20 != -1; local_20 = local_20 + 0xc) {
      iVar2 = ptls_buffer__do_pushv
                        (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                         in_stack_ffffffffffffffa8);
      if (iVar2 != 0) {
        return iVar2;
      }
      local_30 = 2;
      in_stack_ffffffffffffffb0 = (void *)0x2;
      in_stack_ffffffffffffffb8 = in_RSI;
      iVar2 = ptls_buffer__do_pushv(in_RSI,(void *)0x2,in_stack_ffffffffffffffa8);
      if (iVar2 != 0) {
        return iVar2;
      }
      sVar3 = in_RSI->off;
      iVar2 = ptls_buffer__do_pushv
                        (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                         in_stack_ffffffffffffffa8);
      if (iVar2 != 0) {
        return iVar2;
      }
      sVar1 = in_RSI->off;
      for (; local_30 != 0; local_30 = local_30 + -1) {
        in_RSI->base[sVar3 - local_30] =
             (uint8_t)(sVar1 - sVar3 >> (((char)local_30 + -1) * '\b' & 0x3fU));
      }
    }
  }
  return 0;
}

Assistant:

static int push_additional_extensions(ptls_handshake_properties_t *properties, ptls_buffer_t *sendbuf)
{
    int ret;

    if (properties != NULL && properties->additional_extensions != NULL) {
        ptls_raw_extension_t *ext;
        for (ext = properties->additional_extensions; ext->type != UINT16_MAX; ++ext) {
            buffer_push_extension(sendbuf, ext->type, { ptls_buffer_pushv(sendbuf, ext->data.base, ext->data.len); });
        }
    }
    ret = 0;
Exit:
    return ret;
}